

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
          (LayoutBindingNegativeCase *this,Context *context,char *name,char *desc,
          ShaderType shaderType,TestType testType,ErrorType errorType,GLenum maxBindingPointEnum,
          GLenum maxVertexUnitsEnum,GLenum maxTessCtrlUnitsEnum,GLenum maxTessEvalUnitsEnum,
          GLenum maxFragmentUnitsEnum,GLenum maxCombinedUnitsEnum,string *uniformName)

{
  pointer pcVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LayoutBindingNegativeCase_021627b0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_shaderType = shaderType;
  this->m_testType = testType;
  this->m_errorType = errorType;
  this->m_maxBindingPointEnum = maxBindingPointEnum;
  this->m_maxVertexUnitsEnum = maxVertexUnitsEnum;
  this->m_maxFragmentUnitsEnum = maxFragmentUnitsEnum;
  this->m_maxTessCtrlUnitsEnum = maxTessCtrlUnitsEnum;
  this->m_maxTessEvalUnitsEnum = maxTessEvalUnitsEnum;
  this->m_maxCombinedUnitsEnum = maxCombinedUnitsEnum;
  (this->m_uniformName)._M_dataplus._M_p = (pointer)&(this->m_uniformName).field_2;
  pcVar1 = (uniformName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_uniformName,pcVar1,pcVar1 + uniformName->_M_string_length);
  this->m_numBindings = 0;
  (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertexShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fragmentShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tessCtrlShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tessEvalShaderBinding).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_tessSupport = false;
  return;
}

Assistant:

LayoutBindingNegativeCase::LayoutBindingNegativeCase (Context&				context,
													  const char*			name,
													  const char*			desc,
													  ShaderType			shaderType,
													  TestType				testType,
													  ErrorType				errorType,
													  glw::GLenum			maxBindingPointEnum,
													  glw::GLenum			maxVertexUnitsEnum,
													  glw::GLenum			maxTessCtrlUnitsEnum,
													  glw::GLenum			maxTessEvalUnitsEnum,
													  glw::GLenum			maxFragmentUnitsEnum,
													  glw::GLenum			maxCombinedUnitsEnum,
													  const std::string&	uniformName)
	: TestCase					(context, name, desc)
	, m_program					(DE_NULL)
	, m_shaderType				(shaderType)
	, m_testType				(testType)
	, m_errorType				(errorType)
	, m_maxBindingPointEnum		(maxBindingPointEnum)
	, m_maxVertexUnitsEnum		(maxVertexUnitsEnum)
	, m_maxFragmentUnitsEnum	(maxFragmentUnitsEnum)
	, m_maxTessCtrlUnitsEnum	(maxTessCtrlUnitsEnum)
	, m_maxTessEvalUnitsEnum	(maxTessEvalUnitsEnum)
	, m_maxCombinedUnitsEnum	(maxCombinedUnitsEnum)
	, m_uniformName				(uniformName)
	, m_numBindings				(0)
	, m_tessSupport				(false)
{
}